

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,char *name)

{
  bool bVar1;
  pointer this_00;
  cmSourceGroup *pcVar2;
  cmSourceGroup *result;
  iterator end;
  iterator iter;
  char *name_local;
  cmSourceGroup *this_local;
  
  end = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                  (&this->Internal->GroupChildren);
  result = (cmSourceGroup *)
           std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end
                     (&this->Internal->GroupChildren);
  bVar1 = MatchesFiles(this,name);
  this_local = this;
  if (!bVar1) {
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                    *)&result), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                ::operator->(&end);
      pcVar2 = MatchChildrenFiles(this_00,name);
      if (pcVar2 != (cmSourceGroup *)0x0) {
        return pcVar2;
      }
      __gnu_cxx::
      __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
      ::operator++(&end);
    }
    this_local = (cmSourceGroup *)0x0;
  }
  return this_local;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenFiles(const char* name)
{
  // initializing iterators
  std::vector<cmSourceGroup>::iterator iter =
    this->Internal->GroupChildren.begin();
  std::vector<cmSourceGroup>::iterator end =
    this->Internal->GroupChildren.end();

  if (this->MatchesFiles(name)) {
    return this;
  }
  for (; iter != end; ++iter) {
    cmSourceGroup* result = iter->MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return CM_NULLPTR;
}